

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canonical_encoders.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
hanabi_learning_env::CanonicalObservationEncoder::Encode
          (CanonicalObservationEncoder *this,HanabiObservation *obs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AgentObservationType AVar4;
  size_type sVar5;
  HanabiObservation *in_RDX;
  HanabiGame *in_RSI;
  HanabiObservation *in_RDI;
  HanabiGame *unaff_retaddr;
  int offset;
  vector<int,_std::allocator<int>_> *encoding;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vector<int,_std::allocator<int>_> *this_00;
  int local_50;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc4;
  HanabiObservation *in_stack_ffffffffffffffc8;
  HanabiGame *in_stack_ffffffffffffffd0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd8;
  uint3 in_stack_ffffffffffffffe4;
  uint start_offset;
  HanabiGame *game;
  int start_offset_00;
  HanabiObservation *obs_00;
  
  start_offset = (uint)in_stack_ffffffffffffffe4;
  game = in_RSI;
  obs_00 = in_RDI;
  (*(code *)(in_RSI->moves_).
            super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ._M_impl.super__Vector_impl_data._M_start[2])();
  iVar1 = anon_unknown_4::FlatLength
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  sVar5 = (size_type)iVar1;
  uVar6 = 0;
  this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb7;
  std::allocator<int>::allocator((allocator<int> *)0x1554f6);
  std::vector<int,_std::allocator<int>_>::vector
            (this_00,sVar5,
             (value_type *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::allocator<int>::~allocator((allocator<int> *)0x15551b);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  iVar1 = anon_unknown_4::EncodeHands(game,in_RDX,start_offset,in_stack_ffffffffffffffd8);
  iVar2 = anon_unknown_4::EncodeBoard
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                     (vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffffbc,uVar6))
  ;
  iVar3 = anon_unknown_4::EncodeDiscards
                    (unaff_retaddr,obs_00,(int)((ulong)game >> 0x20),
                     (vector<int,_std::allocator<int>_> *)in_RDX);
  local_50 = anon_unknown_4::EncodeLastAction(game,in_RDX,start_offset,in_stack_ffffffffffffffd8);
  start_offset_00 = (int)((ulong)game >> 0x20);
  local_50 = iVar1 + iVar2 + iVar3 + local_50;
  AVar4 = HanabiGame::ObservationType
                    ((HanabiGame *)
                     (in_RSI->moves_).
                     super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (AVar4 != kMinimal) {
    iVar1 = anon_unknown_4::EncodeCardKnowledge
                      (unaff_retaddr,obs_00,start_offset_00,
                       (vector<int,_std::allocator<int>_> *)in_RDX);
    local_50 = iVar1 + local_50;
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)in_RDI);
  if ((long)local_50 != sVar5) {
    __assert_fail("offset == encoding.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/canonical_encoders.cc"
                  ,0x1c2,
                  "virtual std::vector<int> hanabi_learning_env::CanonicalObservationEncoder::Encode(const HanabiObservation &) const"
                 );
  }
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<int> CanonicalObservationEncoder::Encode(
    const HanabiObservation& obs) const {
  // Make an empty bit string of the proper size.
  std::vector<int> encoding(FlatLength(Shape()), 0);

  // This offset is an index to the start of each section of the bit vector.
  // It is incremented at the end of each section.
  int offset = 0;
  offset += EncodeHands(*parent_game_, obs, offset, &encoding);
  offset += EncodeBoard(*parent_game_, obs, offset, &encoding);
  offset += EncodeDiscards(*parent_game_, obs, offset, &encoding);
  offset += EncodeLastAction(*parent_game_, obs, offset, &encoding);
  if (parent_game_->ObservationType() != HanabiGame::kMinimal) {
    offset += EncodeCardKnowledge(*parent_game_, obs, offset, &encoding);
  }

  assert(offset == encoding.size());
  return encoding;
}